

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SilentEntitySystem *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer this_00;
  KString local_200;
  __normal_iterator<const_KDIS::DATA_TYPE::EntityAppearance_*,_std::vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>_>
  local_1e0;
  const_iterator citrEnd;
  const_iterator citr;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  SilentEntitySystem *local_18;
  SilentEntitySystem *this_local;
  
  local_18 = this;
  this_local = (SilentEntitySystem *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"Silent Entity System:\n");
  poVar2 = std::operator<<(poVar2,"Number Of Entities:             ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumEnts);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Appearance Records:   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumOfAppearanceRecords);
  poVar2 = std::operator<<(poVar2,"\n");
  EntityType::GetAsString_abi_cxx11_((KString *)&citr,&this->m_EntTyp);
  std::operator<<(poVar2,(string *)&citr);
  std::__cxx11::string::~string((string *)&citr);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
            ::begin(&this->m_vEA);
  local_1e0._M_current =
       (EntityAppearance *)
       std::
       vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
       ::end(&this->m_vEA);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_1e0);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::EntityAppearance_*,_std::vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>_>
              ::operator->(&citrEnd);
    DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_(&local_200,this_00,&this->m_EntTyp);
    std::operator<<(local_190,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::EntityAppearance_*,_std::vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString SilentEntitySystem::GetAsString() const
{
    KStringStream ss;

    ss << "Silent Entity System:\n"
       << "Number Of Entities:             " << m_ui16NumEnts               << "\n"
       << "Number Of Appearance Records:   " << m_ui16NumOfAppearanceRecords << "\n"
       << m_EntTyp.GetAsString();

    vector<EntityAppearance>::const_iterator citr = m_vEA.begin();
    vector<EntityAppearance>::const_iterator citrEnd = m_vEA.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString( m_EntTyp );
    }

    return ss.str();
}